

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pending_query_result.cpp
# Opt level: O1

PendingExecutionResult __thiscall duckdb::PendingQueryResult::CheckPulse(PendingQueryResult *this)

{
  PendingExecutionResult PVar1;
  ClientContext *this_00;
  PendingQueryResult *lock_00;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  
  lock_00 = this;
  LockContext((PendingQueryResult *)&stack0xffffffffffffffe8);
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>::
  operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
             *)&stack0xffffffffffffffe8);
  CheckExecutableInternal(this,(ClientContextLock *)lock_00);
  this_00 = shared_ptr<duckdb::ClientContext,_true>::operator->(&this->context);
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>::
  operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
             *)&stack0xffffffffffffffe8);
  PVar1 = ClientContext::ExecuteTaskInternal
                    (this_00,(ClientContextLock *)lock_00,&this->super_BaseQueryResult,true);
  ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
  ~unique_ptr((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
               *)&stack0xffffffffffffffe8);
  return PVar1;
}

Assistant:

PendingExecutionResult PendingQueryResult::CheckPulse() {
	auto lock = LockContext();
	CheckExecutableInternal(*lock);
	return context->ExecuteTaskInternal(*lock, *this, true);
}